

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3Fts3NextToken(char *zStr,int *pn)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *z1;
  
  pbVar5 = (byte *)0x0;
  do {
    if (pbVar5 != (byte *)0x0) {
      *pn = (int)pbVar5 - (int)zStr;
      return zStr;
    }
    bVar1 = *zStr;
    if (bVar1 < 0x27) {
      if (bVar1 == 0) {
        pbVar5 = (byte *)0x0;
        bVar3 = false;
      }
      else {
        if (bVar1 == 0x22) goto LAB_001bc407;
LAB_001bc445:
        pbVar5 = (byte *)zStr;
        if (((char)bVar1 < '\0') || (sqlite3Fts3IsIdChar_isFtsIdChar[bVar1] != '\0')) {
          do {
            do {
              pbVar5 = pbVar5 + 1;
            } while ((long)(char)*pbVar5 < 0);
          } while (sqlite3Fts3IsIdChar_isFtsIdChar[(char)*pbVar5] != '\0');
          goto LAB_001bc48a;
        }
        zStr = (char *)((byte *)zStr + 1);
        bVar3 = true;
        pbVar5 = (byte *)0x0;
      }
    }
    else {
      if (bVar1 != 0x27) {
        if (bVar1 == 0x5b) {
          pbVar4 = (byte *)zStr + 1;
          do {
            pbVar5 = pbVar4;
            bVar1 = *pbVar5;
            if (bVar1 == 0x5d) break;
            pbVar4 = pbVar5 + 1;
          } while (bVar1 != 0);
          if (bVar1 != 0) {
            pbVar5 = pbVar5 + 1;
          }
LAB_001bc48a:
          bVar3 = true;
          goto LAB_001bc493;
        }
        if (bVar1 != 0x60) goto LAB_001bc445;
      }
LAB_001bc407:
      bVar2 = ((byte *)zStr)[1];
      bVar3 = true;
      pbVar4 = (byte *)zStr;
      while ((pbVar5 = pbVar4 + 1, bVar2 != 0 &&
             ((bVar2 != bVar1 || (pbVar5 = pbVar4 + 2, pbVar4[2] == bVar1))))) {
        bVar2 = pbVar5[1];
        pbVar4 = pbVar5;
      }
    }
LAB_001bc493:
    if (!bVar3) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE const char *sqlite3Fts3NextToken(const char *zStr, int *pn){
  const char *z1;
  const char *z2 = 0;

  /* Find the start of the next token. */
  z1 = zStr;
  while( z2==0 ){
    char c = *z1;
    switch( c ){
      case '\0': return 0;        /* No more tokens here */
      case '\'':
      case '"':
      case '`': {
        z2 = z1;
        while( *++z2 && (*z2!=c || *++z2==c) );
        break;
      }
      case '[':
        z2 = &z1[1];
        while( *z2 && z2[0]!=']' ) z2++;
        if( *z2 ) z2++;
        break;

      default:
        if( sqlite3Fts3IsIdChar(*z1) ){
          z2 = &z1[1];
          while( sqlite3Fts3IsIdChar(*z2) ) z2++;
        }else{
          z1++;
        }
    }
  }

  *pn = (int)(z2-z1);
  return z1;
}